

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O1

void __thiscall QMenuPrivate::scrollMenu(QMenuPrivate *this,ScrollLocation location,bool active)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  QRect *pQVar7;
  QAction *pQVar8;
  bool bVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  long in_FS_OFFSET;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  int iVar15;
  int iVar16;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = popupGeometry(this,(QScreen *)0x0);
  updateActionRects(this,&local_48);
  if (location == ScrollBottom) {
    uVar11 = (int)(this->super_QWidgetPrivate).actions.d.size - 1;
    if (-1 < (int)uVar11) {
      do {
        while( true ) {
          pQVar7 = (this->actionRects).d.ptr;
          uVar1 = pQVar7[uVar11].x1;
          uVar5 = pQVar7[uVar11].y1;
          uVar2 = pQVar7[uVar11].x2;
          uVar6 = pQVar7[uVar11].y2;
          iVar15 = -(uint)(uVar2 == uVar1 + -1);
          iVar16 = -(uint)(uVar6 == uVar5 + -1);
          auVar14._4_4_ = iVar15;
          auVar14._0_4_ = iVar15;
          auVar14._8_4_ = iVar16;
          auVar14._12_4_ = iVar16;
          iVar15 = movmskpd((int)pQVar7,auVar14);
          if (iVar15 != 3) break;
LAB_004608de:
          uVar11 = uVar11 - 1;
          if ((int)uVar11 < 0) goto LAB_00460906;
        }
        pQVar8 = (this->super_QWidgetPrivate).actions.d.ptr[uVar11];
        bVar9 = considerAction(this,pQVar8);
        if (!bVar9) goto LAB_004608de;
        if ((this->scroll->scrollFlags & 2) == 0) {
          if (active) {
            setCurrentAction(this,pQVar8,-1,SelectedFromKeyboard,false);
          }
        }
        else {
          scrollMenu(this,pQVar8,ScrollBottom,active);
        }
        uVar11 = uVar11 - 1;
      } while (-1 < (int)uVar11 && !bVar9);
    }
  }
  else if ((location == ScrollTop) && ((this->super_QWidgetPrivate).actions.d.size != 0)) {
    lVar12 = 8;
    uVar10 = 0;
    do {
      pQVar7 = (this->actionRects).d.ptr;
      uVar3 = *(undefined8 *)((long)pQVar7 + lVar12 + -8);
      uVar4 = *(undefined8 *)((long)&(pQVar7->x1).m_i + lVar12);
      iVar15 = -(uint)((int)uVar4 == (int)uVar3 + -1);
      iVar16 = -(uint)((int)((ulong)uVar4 >> 0x20) == (int)((ulong)uVar3 >> 0x20) + -1);
      auVar13._4_4_ = iVar15;
      auVar13._0_4_ = iVar15;
      auVar13._8_4_ = iVar16;
      auVar13._12_4_ = iVar16;
      iVar15 = movmskpd((int)pQVar7,auVar13);
      if (iVar15 != 3) {
        pQVar8 = (this->super_QWidgetPrivate).actions.d.ptr[uVar10];
        bVar9 = considerAction(this,pQVar8);
        if (bVar9) {
          if ((this->scroll->scrollFlags & 1) == 0) {
            if (active) {
              setCurrentAction(this,pQVar8,-1,SelectedFromKeyboard,false);
            }
          }
          else {
            scrollMenu(this,pQVar8,ScrollTop,active);
          }
          if (bVar9) break;
        }
      }
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar10 < (ulong)(this->super_QWidgetPrivate).actions.d.size);
  }
LAB_00460906:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuPrivate::scrollMenu(QMenuScroller::ScrollLocation location, bool active)
{
    updateActionRects();
    if (location == QMenuScroller::ScrollBottom) {
        for(int i = actions.size()-1; i >= 0; --i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollDown)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollBottom, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    } else if (location == QMenuScroller::ScrollTop) {
        for(int i = 0; i < actions.size(); ++i) {
            if (actionRects.at(i).isNull())
                continue;
            QAction *act = actions.at(i);
            if (considerAction(act)) {
                if (scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
                    scrollMenu(act, QMenuPrivate::QMenuScroller::ScrollTop, active);
                else if (active)
                    setCurrentAction(act, /*popup*/-1, QMenuPrivate::SelectedFromKeyboard);
                break;
            }
        }
    }
}